

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForFields
          (Context *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  FieldDescriptor *field1;
  FieldDescriptor *field2;
  ushort *puVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  __type _Var7;
  bool bVar8;
  LogMessage *pLVar9;
  pointer ppFVar10;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo>_>
  this_00;
  pointer ppFVar11;
  FieldDescriptor *pFVar12;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *__n;
  string *info_00;
  ulong __n_00;
  reference rVar13;
  string_view name1;
  string_view name1_00;
  string_view v;
  string_view name2;
  string_view name2_00;
  long local_288;
  long local_260;
  FieldDescriptor *local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflict_reason;
  FieldDescriptor *field;
  char *local_220;
  AlphaNum local_1f8;
  string local_1c8;
  vector<bool,_std::allocator<bool>_> is_conflict;
  string local_180;
  FieldGeneratorInfo info;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  
  std::vector<bool,_std::allocator<bool>_>::vector
            (&is_conflict,
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&info);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&conflict_reason,
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&info);
  local_258 = (FieldDescriptor *)0x1;
  local_260 = 0x20;
  __n = (FieldDescriptor *)0x0;
  do {
    ppFVar10 = (fields->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppFVar11 = (fields->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    pFVar12 = (FieldDescriptor *)((long)ppFVar11 - (long)ppFVar10 >> 3);
    if (pFVar12 <= __n) {
      for (__n_00 = 0; __n_00 < (ulong)((long)ppFVar11 - (long)ppFVar10 >> 3); __n_00 = __n_00 + 1)
      {
        field = ppFVar10[__n_00];
        FieldGeneratorInfo::FieldGeneratorInfo(&info);
        CamelCaseFieldName_abi_cxx11_((string *)&local_1f8,(java *)field,field_00);
        std::__cxx11::string::operator=((string *)&info,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        CapitalizedFieldName_abi_cxx11_((string *)&local_1f8,(java *)field,field_01);
        std::__cxx11::string::operator=((string *)&info.capitalized_name,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_conflict,__n_00);
        if ((*rVar13._M_p & rVar13._M_mask) != 0) {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_1f8,field->number_);
          absl::lts_20250127::StrAppend(&info.name,&local_1f8);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_1f8,field->number_);
          absl::lts_20250127::StrAppend(&info.capitalized_name,&local_1f8);
          std::__cxx11::string::_M_assign((string *)&info.disambiguated_reason);
        }
        Options::operator=(&info.options,&this->options_);
        this_00 = absl::lts_20250127::container_internal::
                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>
                  ::
                  operator[]<google::protobuf::FieldDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>>
                            ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>
                              *)&this->field_generator_info_map_,&field);
        FieldGeneratorInfo::operator=(this_00,&info);
        FieldGeneratorInfo::~FieldGeneratorInfo(&info);
        ppFVar10 = (fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppFVar11 = (fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&conflict_reason);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&is_conflict.super__Bvector_base<std::allocator<bool>_>);
      return;
    }
    field1 = ppFVar10[(long)__n];
    CapitalizedFieldName_abi_cxx11_(&local_1c8,(java *)field1,pFVar12);
    local_288 = local_260;
    for (pFVar12 = local_258;
        ppFVar10 = (fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start,
        pFVar12 < (FieldDescriptor *)
                  ((long)(fields->
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10 >> 3);
        pFVar12 = (FieldDescriptor *)&pFVar12->field_0x1) {
      field2 = ppFVar10[(long)pFVar12];
      CapitalizedFieldName_abi_cxx11_(&local_180,(java *)field2,pFVar12);
      _Var7 = std::operator==(&local_1c8,&local_180);
      sVar6 = local_180._M_string_length;
      _Var5._M_p = local_180._M_dataplus._M_p;
      sVar4 = local_1c8._M_string_length;
      _Var3._M_p = local_1c8._M_dataplus._M_p;
      if (_Var7) {
        info.name._0_16_ =
             std::vector<bool,_std::allocator<bool>_>::operator[](&is_conflict,(size_type)pFVar12);
        *info.name._M_dataplus._M_p = *info.name._M_dataplus._M_p | info.name._M_string_length;
        local_1f8.piece_ =
             (string_view)
             std::vector<bool,_std::allocator<bool>_>::operator[](&is_conflict,(size_type)__n);
        std::_Bit_reference::operator=((_Bit_reference *)&local_1f8,(_Bit_reference *)&info);
        info.name._0_16_ = absl::lts_20250127::NullSafeStringView("capitalized name of field \"");
        puVar1 = (ushort *)(field1->all_names_).payload_;
        local_1f8.piece_._M_len = (size_t)*puVar1;
        local_1f8.piece_._M_str = (char *)((long)puVar1 + ~local_1f8.piece_._M_len);
        _field = absl::lts_20250127::NullSafeStringView("\" conflicts with field \"");
        puVar1 = (ushort *)(field2->all_names_).payload_;
        local_80.piece_._M_len = (size_t)*puVar1;
        local_80.piece_._M_str = (char *)((long)puVar1 + ~local_80.piece_._M_len);
        local_b0.piece_ = absl::lts_20250127::NullSafeStringView("\"");
        absl::lts_20250127::StrCat<>
                  (&local_50,(AlphaNum *)&info,&local_1f8,(AlphaNum *)&field,&local_80,&local_b0);
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&((conflict_reason.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                   local_288),(string *)&local_50);
        std::__cxx11::string::_M_assign
                  ((string *)
                   (conflict_reason.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)__n));
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        info_00 = (string *)
                  ((long)&((conflict_reason.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                  local_288);
        name1._M_str = local_1c8._M_dataplus._M_p;
        name1._M_len = local_1c8._M_string_length;
        name2._M_str = local_180._M_dataplus._M_p;
        name2._M_len = local_180._M_string_length;
        bVar8 = anon_unknown_7::IsConflictingOneWay(field1,name1,field2,name2,info_00);
        if (!bVar8) {
          name1_00._M_str = _Var5._M_p;
          name1_00._M_len = sVar6;
          name2_00._M_str = _Var3._M_p;
          name2_00._M_len = sVar4;
          bVar8 = anon_unknown_7::IsConflictingOneWay(field2,name1_00,field1,name2_00,info_00);
          if (!bVar8) goto LAB_00baa732;
        }
        info.name._0_16_ =
             std::vector<bool,_std::allocator<bool>_>::operator[](&is_conflict,(size_type)pFVar12);
        *info.name._M_dataplus._M_p = *info.name._M_dataplus._M_p | info.name._M_string_length;
        local_1f8.piece_ =
             (string_view)
             std::vector<bool,_std::allocator<bool>_>::operator[](&is_conflict,(size_type)__n);
        std::_Bit_reference::operator=((_Bit_reference *)&local_1f8,(_Bit_reference *)&info);
        std::__cxx11::string::_M_assign
                  ((string *)
                   (conflict_reason.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)__n));
      }
LAB_00baa732:
      std::__cxx11::string::~string((string *)&local_180);
      local_288 = local_288 + 0x20;
    }
    rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_conflict,(size_type)__n);
    if ((*rVar13._M_p & rVar13._M_mask) != 0) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)&info,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/context.cc"
                 ,0xa3);
      pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         ((LogMessage *)&info,(char (*) [8])0x110228c);
      pcVar2 = (field1->all_names_).payload_;
      v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
      v._M_str = pcVar2 + ~v._M_len;
      pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar9,v);
      pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar9,(char (*) [18])"\" is conflicting ");
      pLVar9 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar9,(char (*) [21])"with another field: ");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (pLVar9,conflict_reason.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)__n);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&info);
    }
    std::__cxx11::string::~string((string *)&local_1c8);
    local_258 = (FieldDescriptor *)&local_258->field_0x1;
    local_260 = local_260 + 0x20;
    __n = (FieldDescriptor *)&__n->field_0x1;
  } while( true );
}

Assistant:

void Context::InitializeFieldGeneratorInfoForFields(
    const std::vector<const FieldDescriptor*>& fields) {
  // Find out all fields that conflict with some other field in the same
  // message.
  std::vector<bool> is_conflict(fields.size());
  std::vector<std::string> conflict_reason(fields.size());
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    const std::string& name = CapitalizedFieldName(field);
    for (int j = i + 1; j < fields.size(); ++j) {
      const FieldDescriptor* other = fields[j];
      const std::string& other_name = CapitalizedFieldName(other);
      if (name == other_name) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j] =
            absl::StrCat("capitalized name of field \"", field->name(),
                         "\" conflicts with field \"", other->name(), "\"");
      } else if (IsConflicting(field, name, other, other_name,
                               &conflict_reason[j])) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j];
      }
    }
    if (is_conflict[i]) {
      ABSL_LOG(WARNING) << "field \"" << field->full_name()
                        << "\" is conflicting "
                        << "with another field: " << conflict_reason[i];
    }
  }
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    FieldGeneratorInfo info;
    info.name = CamelCaseFieldName(field);
    info.capitalized_name = CapitalizedFieldName(field);
    // For fields conflicting with some other fields, we append the field
    // number to their field names in generated code to avoid conflicts.
    if (is_conflict[i]) {
      absl::StrAppend(&info.name, field->number());
      absl::StrAppend(&info.capitalized_name, field->number());
      info.disambiguated_reason = conflict_reason[i];
    }
    info.options = options_;
    field_generator_info_map_[field] = info;
  }
}